

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SettingsHandlerWindow_WriteAll
               (ImGuiContext *imgui_ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  ImGuiWindowSettings *pIVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  
  uVar3 = (imgui_ctx->Windows).Size;
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      if ((long)(int)uVar3 <= (long)uVar7) {
        pcVar6 = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0017fb97;
      }
      pIVar2 = (imgui_ctx->Windows).Data[uVar7];
      if ((pIVar2->Flags & 0x100) == 0) {
        pIVar4 = ImGui::FindWindowSettings(pIVar2->ID);
        if (pIVar4 == (ImGuiWindowSettings *)0x0) {
          pIVar4 = AddWindowSettings(pIVar2->Name);
        }
        pIVar4->Pos = pIVar2->Pos;
        pIVar4->Size = pIVar2->SizeFull;
        pIVar4->Collapsed = pIVar2->Collapsed;
        uVar3 = (imgui_ctx->Windows).Size;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar3);
  }
  ImGuiTextBuffer::reserve(buf,(buf->Buf).Size + (imgui_ctx->SettingsWindows).Size * 0x60 + -1);
  uVar3 = (imgui_ctx->SettingsWindows).Size;
  if (uVar3 != 0) {
    lVar8 = 0x1c;
    uVar7 = 0;
    do {
      if ((long)(int)uVar3 <= (long)uVar7) {
        pcVar6 = 
        "value_type &ImVector<ImGuiWindowSettings>::operator[](int) [T = ImGuiWindowSettings]";
LAB_0017fb97:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c0,pcVar6);
      }
      pIVar4 = (imgui_ctx->SettingsWindows).Data;
      fVar1 = *(float *)((long)pIVar4 + lVar8 + -0x10);
      if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
        pcVar6 = *(char **)((long)pIVar4 + lVar8 + -0x1c);
        pcVar5 = strstr(pcVar6,"###");
        if (pcVar5 != (char *)0x0) {
          pcVar6 = pcVar5;
        }
        ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pcVar6);
        ImGuiTextBuffer::appendf
                  (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar4 + lVar8 + -0x10),
                   (ulong)(uint)(int)*(float *)((long)pIVar4 + lVar8 + -0xc));
        ImGuiTextBuffer::appendf
                  (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar4 + lVar8 + -8),
                   (ulong)(uint)(int)*(float *)((long)pIVar4 + lVar8 + -4));
        ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)*(byte *)((long)&pIVar4->Name + lVar8))
        ;
        ImGuiTextBuffer::appendf(buf,"\n");
        uVar3 = (imgui_ctx->SettingsWindows).Size;
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar7 != uVar3);
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_WriteAll(ImGuiContext* imgui_ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    ImGuiContext& g = *imgui_ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;
        ImGuiWindowSettings* settings = ImGui::FindWindowSettings(window->ID);
        if (!settings)
            settings = AddWindowSettings(window->Name);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write a buffer
    // If a window wasn't opened in this session we preserve its settings
    buf->reserve(buf->size() + g.SettingsWindows.Size * 96); // ballpark reserve
    for (int i = 0; i != g.SettingsWindows.Size; i++)
    {
        const ImGuiWindowSettings* settings = &g.SettingsWindows[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        buf->appendf("[%s][%s]\n", handler->TypeName, name);
        buf->appendf("Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        buf->appendf("Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->appendf("\n");
    }
}